

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

overlap_iterator * __thiscall
slang::IntervalMap<int,_int,_0U>::find
          (overlap_iterator *__return_storage_ptr__,IntervalMap<int,_int,_0U> *this,int left,
          int right)

{
  (__return_storage_ptr__->super_iterator).super_const_iterator.map = this;
  (__return_storage_ptr__->super_iterator).super_const_iterator.path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ =
       (pointer)(__return_storage_ptr__->super_iterator).super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement;
  (__return_storage_ptr__->super_iterator).super_const_iterator.path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len = 0;
  (__return_storage_ptr__->super_iterator).super_const_iterator.path.path.
  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.cap = 2;
  (__return_storage_ptr__->searchKey).left = left;
  (__return_storage_ptr__->searchKey).right = right;
  overlap_iterator::setToBegin(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

overlap_iterator find(TKey left, TKey right) const {
        overlap_iterator it(*this, left, right);
        it.setToBegin();
        return it;
    }